

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlendFuncSeparate
          (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,GLenum sourceRGB,GLenum destinationRGB,GLenum sourceAlpha,GLenum destinationAlpha)

{
  GLenum in_ECX;
  GLenum in_EDX;
  GLenum in_ESI;
  long in_RDI;
  GLenum in_R8D;
  GLuint i;
  GLenum in_stack_ffffffffffffffe0;
  GLenum in_stack_ffffffffffffffe4;
  uint uVar1;
  
  if ((in_ESI == in_ECX) && (in_EDX == in_R8D)) {
    setBlendFunc((COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
                  *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D);
  }
  else if (((**(GLenum **)(in_RDI + 0x58) != in_ESI) ||
           (((**(GLenum **)(in_RDI + 0x60) != in_EDX || (**(GLenum **)(in_RDI + 0x68) != in_ECX)) ||
            (**(GLenum **)(in_RDI + 0x70) != in_R8D)))) || ((*(byte *)(in_RDI + 0x81) & 1) != 0)) {
    COpenGLExtensionHandler::irrGlBlendFuncSeparate
              ((COpenGLExtensionHandler *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
               in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    for (uVar1 = 0; uVar1 < *(uint *)(in_RDI + 0x48); uVar1 = uVar1 + 1) {
      *(GLenum *)(*(long *)(in_RDI + 0x58) + (ulong)uVar1 * 4) = in_ESI;
      *(GLenum *)(*(long *)(in_RDI + 0x60) + (ulong)uVar1 * 4) = in_EDX;
      *(GLenum *)(*(long *)(in_RDI + 0x68) + (ulong)uVar1 * 4) = in_ECX;
      *(GLenum *)(*(long *)(in_RDI + 0x70) + (ulong)uVar1 * 4) = in_R8D;
    }
    *(undefined1 *)(in_RDI + 0x81) = 0;
  }
  return;
}

Assistant:

void setBlendFuncSeparate(GLenum sourceRGB, GLenum destinationRGB, GLenum sourceAlpha, GLenum destinationAlpha)
	{
		if (sourceRGB != sourceAlpha || destinationRGB != destinationAlpha) {
			if (BlendSourceRGB[0] != sourceRGB || BlendDestinationRGB[0] != destinationRGB ||
					BlendSourceAlpha[0] != sourceAlpha || BlendDestinationAlpha[0] != destinationAlpha ||
					BlendFuncInvalid) {
				Driver->irrGlBlendFuncSeparate(sourceRGB, destinationRGB, sourceAlpha, destinationAlpha);

				for (GLuint i = 0; i < FrameBufferCount; ++i) {
					BlendSourceRGB[i] = sourceRGB;
					BlendDestinationRGB[i] = destinationRGB;
					BlendSourceAlpha[i] = sourceAlpha;
					BlendDestinationAlpha[i] = destinationAlpha;
				}

				BlendFuncInvalid = false;
			}
		} else {
			setBlendFunc(sourceRGB, destinationRGB);
		}
	}